

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsp.hh
# Opt level: O0

PathResult
wsp(Position *start,function<bool_(Position)> *reached_end,State *state,
   function<int_(Position)> *cell_cost)

{
  Position initial;
  bool bVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  vector<char,_std::allocator<char>_> *pvVar5;
  const_reference pvVar6;
  reference pcVar7;
  reference pvVar8;
  reference pvVar9;
  reference rVar10;
  byte local_252;
  CostPathStep local_1cc;
  Position local_1b8;
  int local_1ac;
  int iStack_1a8;
  int c;
  Position s_1;
  Direction *dir_1;
  iterator iStack_190;
  char d_1;
  iterator __end3;
  iterator __begin3;
  vector<char,_std::allocator<char>_> *__range3;
  _Bit_type local_170;
  reference local_168;
  Position PStack_158;
  CostPathStep a;
  CostPathStep local_134;
  Position local_120;
  Position local_118;
  Position s;
  Direction *dir;
  iterator iStack_100;
  char d;
  iterator __end1;
  iterator __begin1;
  vector<char,_std::allocator<char>_> *__range1;
  _Bit_type local_e0;
  allocator<std::vector<int,_std::allocator<int>_>_> local_d2;
  allocator<int> local_d1;
  vector<int,_std::allocator<int>_> local_d0;
  undefined1 local_b8 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  C;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *S;
  vector<CostPathStep,_std::allocator<CostPathStep>_> local_88;
  undefined1 local_68 [8];
  priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_albertsgrc[P]q_mspacman_src_agents_pacman_______pathfinding_wsp_hh:24:17)>
  Q;
  anon_class_1_0_00000001 comp;
  function<int_(Position)> *cell_cost_local;
  State *state_local;
  function<bool_(Position)> *reached_end_local;
  Position *start_local;
  
  bVar1 = std::function<bool_(Position)>::operator()(reached_end,*start);
  if (bVar1) {
    PathResult::PathResult((PathResult *)&start_local,&Direction::STAY,0);
  }
  else {
    local_88.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<CostPathStep,_std::allocator<CostPathStep>_>::vector(&local_88);
    std::
    priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/agents/pacman/../../pathfinding/wsp.hh:24:17)>
    ::priority_queue((priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_albertsgrc[P]q_mspacman_src_agents_pacman_______pathfinding_wsp_hh:24:17)>
                      *)local_68,(anon_class_1_0_00000001 *)&Q.field_0x1f,&local_88);
    std::vector<CostPathStep,_std::allocator<CostPathStep>_>::~vector(&local_88);
    SeenMatrix::reset();
    C.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&SeenMatrix::S;
    iVar2 = Matrix<char>::rows(&state->maze);
    iVar3 = Matrix<char>::cols(&state->maze);
    std::allocator<int>::allocator(&local_d1);
    std::vector<int,_std::allocator<int>_>::vector(&local_d0,(long)iVar3,&MAXINT,&local_d1);
    std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(&local_d2);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)local_b8,(long)iVar2,&local_d0,&local_d2);
    std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator(&local_d2);
    std::vector<int,_std::allocator<int>_>::~vector(&local_d0);
    std::allocator<int>::~allocator(&local_d1);
    pvVar4 = std::
             vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ::operator[](&SeenMatrix::S,(long)start->i);
    rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar4,(long)start->j);
    local_e0 = rVar10._M_mask;
    __range1 = (vector<char,_std::allocator<char>_> *)rVar10._M_p;
    std::_Bit_reference::operator=((_Bit_reference *)&__range1,true);
    pvVar5 = PathMagic::dirs(start);
    __end1 = std::vector<char,_std::allocator<char>_>::begin(pvVar5);
    iStack_100 = std::vector<char,_std::allocator<char>_>::end(pvVar5);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff00);
      if (!bVar1) break;
      pcVar7 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&__end1);
      s = (Position)(Direction::LIST + *pcVar7);
      local_120 = Position::move_destination(start,(Direction *)s);
      local_118 = local_120;
      iVar2 = std::function<int_(Position)>::operator()(cell_cost,local_120);
      pvVar8 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_b8,(long)local_118.i);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](pvVar8,(long)local_118.j);
      initial = s;
      *pvVar9 = iVar2;
      pvVar8 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_b8,(long)local_118.i);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](pvVar8,(long)local_118.j);
      CostPathStep::CostPathStep(&local_134,&local_118,(Direction *)initial,*pvVar9);
      std::
      priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/agents/pacman/../../pathfinding/wsp.hh:24:17)>
      ::push((priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_albertsgrc[P]q_mspacman_src_agents_pacman_______pathfinding_wsp_hh:24:17)>
              *)local_68,&local_134);
      __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                (&__end1);
    }
    while( true ) {
      bVar1 = std::
              priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/agents/pacman/../../pathfinding/wsp.hh:24:17)>
              ::empty((priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_albertsgrc[P]q_mspacman_src_agents_pacman_______pathfinding_wsp_hh:24:17)>
                       *)local_68);
      local_252 = 0;
      if (!bVar1) {
        pvVar6 = std::
                 priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/agents/pacman/../../pathfinding/wsp.hh:24:17)>
                 ::top((priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_albertsgrc[P]q_mspacman_src_agents_pacman_______pathfinding_wsp_hh:24:17)>
                        *)local_68);
        unique0x00012000 = pvVar6->pos;
        bVar1 = std::function<bool_(Position)>::operator()(reached_end,unique0x00012000);
        local_252 = bVar1 ^ 0xff;
      }
      if ((local_252 & 1) == 0) break;
      pvVar6 = std::
               priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/agents/pacman/../../pathfinding/wsp.hh:24:17)>
               ::top((priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_albertsgrc[P]q_mspacman_src_agents_pacman_______pathfinding_wsp_hh:24:17)>
                      *)local_68);
      a.initial.i = pvVar6->cost;
      PStack_158 = pvVar6->pos;
      a.pos = *(Position *)&pvVar6->initial;
      std::
      priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/agents/pacman/../../pathfinding/wsp.hh:24:17)>
      ::pop((priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_albertsgrc[P]q_mspacman_src_agents_pacman_______pathfinding_wsp_hh:24:17)>
             *)local_68);
      pvVar4 = std::
               vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ::operator[](&SeenMatrix::S,(long)PStack_158.i);
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar4,(long)PStack_158.j);
      local_168 = rVar10;
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_168);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        pvVar4 = std::
                 vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                 ::operator[](&SeenMatrix::S,(long)PStack_158.i);
        rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar4,(long)PStack_158.j);
        local_170 = rVar10._M_mask;
        __range3 = (vector<char,_std::allocator<char>_> *)rVar10._M_p;
        std::_Bit_reference::operator=((_Bit_reference *)&__range3,true);
        pvVar5 = PathMagic::dirs(&PStack_158);
        __end3 = std::vector<char,_std::allocator<char>_>::begin(pvVar5);
        iStack_190 = std::vector<char,_std::allocator<char>_>::end(pvVar5);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffffe70);
          if (!bVar1) break;
          pcVar7 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator*(&__end3);
          s_1 = (Position)(Direction::LIST + *pcVar7);
          local_1b8 = Position::move_destination(&PStack_158,(Direction *)s_1);
          _iStack_1a8 = local_1b8;
          local_1ac = std::function<int_(Position)>::operator()(cell_cost,local_1b8);
          local_1ac = local_1ac + 1;
          pvVar8 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)local_b8,(long)PStack_158.i);
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](pvVar8,(long)PStack_158.j);
          iVar2 = *pvVar9 + local_1ac;
          pvVar8 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)local_b8,(long)iStack_1a8);
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](pvVar8,(long)c);
          if (iVar2 < *pvVar9) {
            pvVar8 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)local_b8,(long)PStack_158.i);
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](pvVar8,(long)PStack_158.j);
            iVar2 = *pvVar9 + local_1ac;
            pvVar8 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)local_b8,(long)iStack_1a8);
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](pvVar8,(long)c);
            *pvVar9 = iVar2;
            pvVar8 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)local_b8,(long)iStack_1a8);
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](pvVar8,(long)c);
            CostPathStep::CostPathStep
                      (&local_1cc,(Position *)&stack0xfffffffffffffe58,(Direction *)&a,*pvVar9);
            std::
            priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/agents/pacman/../../pathfinding/wsp.hh:24:17)>
            ::push((priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_albertsgrc[P]q_mspacman_src_agents_pacman_______pathfinding_wsp_hh:24:17)>
                    *)local_68,&local_1cc);
          }
          __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
          operator++(&__end3);
        }
      }
    }
    bVar1 = std::
            priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/agents/pacman/../../pathfinding/wsp.hh:24:17)>
            ::empty((priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_albertsgrc[P]q_mspacman_src_agents_pacman_______pathfinding_wsp_hh:24:17)>
                     *)local_68);
    if (bVar1) {
      PathResult::PathResult((PathResult *)&start_local,false);
    }
    else {
      pvVar6 = std::
               priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/agents/pacman/../../pathfinding/wsp.hh:24:17)>
               ::top((priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_albertsgrc[P]q_mspacman_src_agents_pacman_______pathfinding_wsp_hh:24:17)>
                      *)local_68);
      PathResult::PathResult((PathResult *)&start_local,&pvVar6->initial,0);
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)local_b8);
    std::
    priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/agents/pacman/../../pathfinding/wsp.hh:24:17)>
    ::~priority_queue((priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_albertsgrc[P]q_mspacman_src_agents_pacman_______pathfinding_wsp_hh:24:17)>
                       *)local_68);
  }
  return _start_local;
}

Assistant:

PathResult wsp(const Position& start,
                          function<bool(Position)> reached_end,
                          const State& state,
                          function<int(Position)> cell_cost) {

    if (reached_end(start)) return PathResult(Direction::STAY, 0);

    auto comp = [](const CostPathStep& a, const CostPathStep& b) {
        return a.cost > b.cost;
    };

    priority_queue<CostPathStep, vector<CostPathStep>, decltype(comp)> Q(comp);
    SeenMatrix::reset();
    vector<vector<bool>>& S = SeenMatrix::S;
    vector<vector<int>> C(state.maze.rows(), vector<int>(state.maze.cols(), MAXINT));

    S[start.i][start.j] = true;

    for (char d : PathMagic::dirs(start)) {
        const Direction& dir = Direction::LIST[(int)d];
        Position s = start.move_destination(dir);

        C[s.i][s.j] = cell_cost(s);
        Q.push(CostPathStep(s, dir, C[s.i][s.j]));
    }

    while (not Q.empty() and not reached_end(Q.top().pos)) {
        CostPathStep a = Q.top(); Q.pop();
        if (not S[a.pos.i][a.pos.j]) {
            S[a.pos.i][a.pos.j] = true;
            for (char d : PathMagic::dirs(a.pos)) {
                const Direction& dir = Direction::LIST[(int)d];
                Position s = a.pos.move_destination(dir);
                int c = cell_cost(s) + 1;
                if (C[a.pos.i][a.pos.j] + c < C[s.i][s.j]) {
                    C[s.i][s.j] = C[a.pos.i][a.pos.j] + c;
                    Q.push(CostPathStep(s, a.initial, C[s.i][s.j]));
    }   }   }   }

    return Q.empty() ? PathResult(false) : PathResult(Q.top().initial, 0);
}